

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

float __thiscall w3Module::read_f32(w3Module *this,uint8_t **cursor)

{
  uint8_t uVar1;
  uint32_t i;
  long lVar2;
  anon_union_4_2_095b825b u;
  float local_1c;
  
  lVar2 = 0;
  do {
    uVar1 = ::read_byte(cursor,this->end);
    *(uint8_t *)((long)&local_1c + lVar2) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return local_1c;
}

Assistant:

float w3Module::read_f32 (uint8_t** cursor)
// floats are not variably sized? Spec is unclear due to fancy notation
// getting in the way.
{
    union {
        uint8_t bytes [4];
        float f32;
    } u;
    for (uint32_t i = 0; i < 4; ++i)
        u.bytes [i] = (uint8_t)read_byte (cursor);
    return u.f32;
}